

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall
tf::Executor::_invoke_multi_condition_task
          (Executor *this,Worker *worker,Node *node,SmallVector<int,_2U> *conds)

{
  Node *in_RCX;
  Worker *in_RDX;
  Executor *in_RSI;
  SmallVector<int,_2U> *in_RDI;
  SmallVector<int,_2U> *in_stack_ffffffffffffffb0;
  function<tf::SmallVector<int,_2U>_()> *in_stack_ffffffffffffffb8;
  
  _observer_prologue(in_RSI,in_RDX,in_RCX);
  std::
  get_if<tf::Node::MultiCondition,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
            ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              *)0x1b6041);
  std::function<tf::SmallVector<int,_2U>_()>::operator()(in_stack_ffffffffffffffb8);
  SmallVector<int,_2U>::operator=(in_stack_ffffffffffffffb0,in_RDI);
  SmallVector<int,_2U>::~SmallVector((SmallVector<int,_2U> *)0x1b606b);
  _observer_epilogue(in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

inline void Executor::_invoke_multi_condition_task(
  Worker& worker, Node* node, SmallVector<int>& conds
) {
  _observer_prologue(worker, node);
  TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
    conds = std::get_if<Node::MultiCondition>(&node->_handle)->work();
  });
  _observer_epilogue(worker, node);
}